

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O2

bool __thiscall Opcode::AABBTree::Refit2(AABBTree *this,AABBTreeBuilder *builder)

{
  AABBTreeNode *pAVar1;
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Point local_48;
  Point local_38;
  
  if (builder != (AABBTreeBuilder *)0x0) {
    lVar5 = (ulong)this->mTotalNbNodes * 0x30;
    while (lVar4 = lVar5 + -0x30, lVar4 != -0x30) {
      pAVar1 = this->mPool;
      puVar3 = (undefined8 *)(*(ulong *)((long)&pAVar1[-1].mPos + lVar5) & 0xfffffffffffffffe);
      if (puVar3 == (undefined8 *)0x0) {
        (*builder->_vptr_AABBTreeBuilder[2])
                  (builder,*(undefined8 *)((long)&pAVar1[-1].mNodePrimitives + lVar5),
                   (ulong)*(uint *)((long)&pAVar1[-1].mNbPrimitives + lVar5));
        lVar5 = lVar4;
      }
      else {
        local_48.z = *(float *)(puVar3 + 1) - *(float *)((long)puVar3 + 0x14);
        fVar9 = (float)*(undefined8 *)((long)puVar3 + 0xc);
        auVar8._0_4_ = (float)*puVar3 - fVar9;
        fVar10 = (float)((ulong)*(undefined8 *)((long)puVar3 + 0xc) >> 0x20);
        auVar8._4_4_ = (float)((ulong)*puVar3 >> 0x20) - fVar10;
        auVar8._8_8_ = 0;
        local_38.z = *(float *)((long)puVar3 + 0x14) + *(float *)(puVar3 + 1);
        fVar15 = *(float *)(puVar3 + 7) - *(float *)((long)puVar3 + 0x44);
        fVar11 = *(float *)(puVar3 + 7) + *(float *)((long)puVar3 + 0x44);
        if (local_38.z <= fVar11) {
          local_38.z = fVar11;
        }
        fVar11 = (float)puVar3[6];
        fVar12 = (float)((ulong)puVar3[6] >> 0x20);
        fVar13 = (float)*(undefined8 *)((long)puVar3 + 0x3c);
        fVar14 = (float)((ulong)*(undefined8 *)((long)puVar3 + 0x3c) >> 0x20);
        auVar7._4_4_ = fVar12 - fVar14;
        auVar7._0_4_ = fVar11 - fVar13;
        auVar7._8_8_ = 0;
        auVar8 = minps(auVar8,auVar7);
        if (fVar15 <= local_48.z) {
          local_48.z = fVar15;
        }
        auVar6._0_4_ = (float)*puVar3 + fVar9;
        auVar6._4_4_ = (float)((ulong)*puVar3 >> 0x20) + fVar10;
        auVar6._8_8_ = 0;
        auVar2._4_4_ = fVar12 + fVar14;
        auVar2._0_4_ = fVar11 + fVar13;
        auVar2._8_8_ = 0;
        auVar7 = maxps(auVar6,auVar2);
        local_48._0_8_ = auVar8._0_8_;
        local_38._0_8_ = auVar7._0_8_;
        IceMaths::AABB::SetMinMax
                  ((AABB *)((long)&pAVar1[-1].mBV.mCenter.x + lVar5),&local_48,&local_38);
        lVar5 = lVar4;
      }
    }
  }
  return builder != (AABBTreeBuilder *)0x0;
}

Assistant:

bool AABBTree::Refit2(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder)	return false;

	ASSERT(mPool);

	// Bottom-up update
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mTotalNbNodes;
	while(Index--)
	{
		AABBTreeNode& Current = mPool[Index];

		if(Current.IsLeaf())
		{
			builder->ComputeGlobalBox(Current.GetPrimitives(), Current.GetNbPrimitives(), *(AABB*)Current.GetAABB());
		}
		else
		{
			Current.GetPos()->GetAABB()->GetMin(Min);
			Current.GetPos()->GetAABB()->GetMax(Max);

			Current.GetNeg()->GetAABB()->GetMin(Min_);
			Current.GetNeg()->GetAABB()->GetMax(Max_);

			Min.Min(Min_);
			Max.Max(Max_);

			((AABB*)Current.GetAABB())->SetMinMax(Min, Max);
		}
	}
	return true;
}